

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringVisitor.cpp
# Opt level: O0

void __thiscall binlog::ToStringVisitor::visit(ToStringVisitor *this,FieldBegin fb)

{
  bool bVar1;
  undefined4 *in_RDI;
  OstreamBuffer *this_00;
  ostream *str;
  OstreamBuffer *this_01;
  
  this_00 = (OstreamBuffer *)&stack0x00000008;
  comma((ToStringVisitor *)this_00);
  bVar1 = mserialize::string_view::empty((string_view *)this_00);
  if (!bVar1) {
    str = this_00->_out;
    this_01 = *(OstreamBuffer **)(this_00->_buf)._M_elems;
    detail::OstreamBuffer::operator<<(this_00,*(string_view *)this_00);
    detail::OstreamBuffer::operator<<(this_01,(char *)str);
  }
  *in_RDI = 0;
  return;
}

Assistant:

void ToStringVisitor::visit(mserialize::Visitor::FieldBegin fb)
{
  comma();
  if (! fb.name.empty())
  {
    _out << fb.name << ": ";
  }
  _state = State::Normal;
}